

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void report_error(gvisitor_t *self,gnode_t *node,char *format,...)

{
  undefined8 *puVar1;
  char in_AL;
  ulong uVar2;
  uint32_t uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 in_R8;
  ulong uVar7;
  undefined8 in_R9;
  code *pcVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char buffer [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [24];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1024];
  
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  if (node == (gnode_t *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (node->token).lineno;
    if (uVar3 == *(uint32_t *)((long)self->data + 0x30)) {
      return;
    }
  }
  self->nerr = self->nerr + 1;
  *(uint32_t *)((long)self->data + 0x30) = uVar3;
  puVar1 = (undefined8 *)self->delegate;
  if (puVar1 == (undefined8 *)0x0) {
    uVar6 = 0;
    pcVar8 = (code *)0x0;
  }
  else {
    uVar6 = *puVar1;
    pcVar8 = (code *)puVar1[4];
  }
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  if (format != (char *)0x0) {
    local_4d8 = local_4c8;
    local_4e0 = &arg[0].overflow_arg_area;
    local_4e8 = 0x3000000018;
    vsnprintf(local_418,0x400,format,&local_4e8);
  }
  if (node == (gnode_t *)0x0) {
    uVar2 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar7 = 0;
  }
  else {
    uVar2 = (ulong)(node->token).lineno;
    uVar4 = (ulong)(node->token).colno << 0x20;
    uVar5 = (ulong)(node->token).fileid;
    uVar7 = (ulong)(node->token).position << 0x20;
  }
  if (pcVar8 == (code *)0x0) {
    puts(local_418);
  }
  else {
    (*pcVar8)(0,2,local_418,uVar4 | uVar2,uVar7 | uVar5,uVar6);
  }
  return;
}

Assistant:

static void report_error (gvisitor_t *self, gnode_t *node, const char *format, ...) {
    codegen_t *current = (codegen_t *)self->data;
    
    // check last error line in order to prevent to emit multiple errors for the same row
    if (node && node->token.lineno == current->lasterror) return;
    
    // increment internal error counter and save location of the last reported error (no WARNING cases here)
    ++self->nerr;
    current->lasterror = (node) ? node->token.lineno : 0;

    // get error callback (if any)
    void *data = (self->delegate) ? ((gravity_delegate_t *)self->delegate)->xdata : NULL;
    gravity_error_callback error_fn = (self->delegate) ? ((gravity_delegate_t *)self->delegate)->error_callback : NULL;

    // build error message
    char buffer[1024];
    va_list arg;
    if (format) {
        va_start (arg, format);
        vsnprintf(buffer, sizeof(buffer), format, arg);
        va_end (arg);
    }

    // setup error struct
    error_desc_t error_desc = {
        .lineno = (node) ? node->token.lineno : 0,
        .colno = (node) ? node->token.colno : 0,
        .fileid = (node) ? node->token.fileid : 0,
        .offset = (node) ? node->token.position : 0
    };

    // finally call error callback
    if (error_fn) error_fn(NULL, GRAVITY_ERROR_SEMANTIC, buffer, error_desc, data);
    else printf("%s\n", buffer);
}